

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O1

void __thiscall
Fixpp::Field<Fixpp::TagT<241U,_Fixpp::Type::String>_>::Field
          (Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *other)

{
  (this->val_)._M_dataplus._M_p = (pointer)&(this->val_).field_2;
  (this->val_)._M_string_length = 0;
  (this->val_).field_2._M_local_buf[0] = '\0';
  this->empty_ = false;
  if (other->empty_ == false) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->val_,&other->val_);
  }
  this->empty_ = other->empty_;
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }